

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_recv(telnet_t *telnet,char *buffer,size_t size)

{
  z_stream *pzVar1;
  uint uVar2;
  undefined8 uVar3;
  telnet_event_t ev;
  char inflate_buffer [1024];
  telnet_event_t local_450;
  Bytef local_428 [1024];
  
  pzVar1 = telnet->z;
  if ((pzVar1 == (z_stream *)0x0) || ((char)telnet->flags < '\0')) {
    _process(telnet,buffer,size);
    return;
  }
  pzVar1->next_in = (Bytef *)buffer;
  pzVar1->avail_in = (uInt)size;
  pzVar1->next_out = local_428;
  pzVar1->avail_out = 0x400;
  do {
    pzVar1 = telnet->z;
    if ((pzVar1->avail_in == 0) && (pzVar1->avail_out != 0)) {
      return;
    }
    uVar2 = inflate(pzVar1,2);
    if (uVar2 < 2) {
      _process(telnet,(char *)local_428,0x400 - (ulong)telnet->z->avail_out);
    }
    else {
      uVar3 = zError(uVar2);
      _error(telnet,0x519,"telnet_recv",TELNET_ECOMPRESS,1,"inflate() failed: %s",uVar3);
    }
    pzVar1 = telnet->z;
    pzVar1->next_out = local_428;
    pzVar1->avail_out = 0x400;
  } while (uVar2 == 0);
  inflateEnd();
  free(telnet->z);
  telnet->z = (z_stream *)0x0;
  local_450.type = TELNET_EV_COMPRESS;
  local_450.iac.cmd = '\0';
  (*telnet->eh)(telnet,&local_450,telnet->ud);
  return;
}

Assistant:

void telnet_recv(telnet_t *telnet, const char *buffer,
		size_t size) {
#if defined(HAVE_ZLIB)
	/* if we have an inflate (decompression) zlib stream, use it */
	if (telnet->z != 0 && !(telnet->flags & TELNET_PFLAG_DEFLATE)) {
		char inflate_buffer[1024];
		int rs;

		/* initialize zlib state */
		telnet->z->next_in = (unsigned char*)buffer;
		telnet->z->avail_in = (unsigned int)size;
		telnet->z->next_out = (unsigned char *)inflate_buffer;
		telnet->z->avail_out = sizeof(inflate_buffer);

		/* inflate until buffer exhausted and all output is produced */
		while (telnet->z->avail_in > 0 || telnet->z->avail_out == 0) {
			/* reset output buffer */

			/* decompress */
			rs = inflate(telnet->z, Z_SYNC_FLUSH);

			/* process the decompressed bytes on success */
			if (rs == Z_OK || rs == Z_STREAM_END)
				_process(telnet, inflate_buffer, sizeof(inflate_buffer) -
						telnet->z->avail_out);
			else
				_error(telnet, __LINE__, __func__, TELNET_ECOMPRESS, 1,
						"inflate() failed: %s", zError(rs));

			/* prepare output buffer for next run */
			telnet->z->next_out = (unsigned char *)inflate_buffer;
			telnet->z->avail_out = sizeof(inflate_buffer);

			/* on error (or on end of stream) disable further inflation */
			if (rs != Z_OK) {
				telnet_event_t ev;

				/* disable compression */
				inflateEnd(telnet->z);
				free(telnet->z);
				telnet->z = 0;

				/* send event */
				ev.type = TELNET_EV_COMPRESS;
				ev.compress.state = 0;
				telnet->eh(telnet, &ev, telnet->ud);

				break;
			}
		}

	/* COMPRESS2 is not negotiated, just process */
	} else
#endif /* defined(HAVE_ZLIB) */
		_process(telnet, buffer, size);
}